

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.h
# Opt level: O1

void __thiscall
YacclabTests::CheckAlgorithms<void(Labeling::*)()>
          (YacclabTests *this,string *title,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ccl_algorithms,offset_in_Labeling_to_subr func)

{
  pointer pcVar1;
  GlobalConfig *pGVar2;
  bool bVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  pointer ppVar5;
  pointer ppVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  Labeling *pLVar11;
  pointer pbVar12;
  path *ppVar13;
  Labeling *pLVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  code *pcVar15;
  undefined4 extraout_var_01;
  long *plVar16;
  undefined8 *puVar17;
  size_type *psVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  YacclabTests *pYVar20;
  String *rhs;
  pointer pbVar21;
  long lVar22;
  ulong uVar23;
  undefined8 uVar24;
  long in_R8;
  pointer lhs;
  _Bit_iterator _Var25;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  string dataset_name;
  path is_path;
  out_of_range anon_var_0;
  unique_ptr<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_> labels_correct;
  path filename_path;
  vector<bool,_std::allocator<bool>_> stats;
  string correct_algo_name;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  filenames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  first_fail;
  OutputBox ob;
  string local_2f0;
  string local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  path local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  long *local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_248;
  code *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  long *local_218;
  long local_210;
  long local_208 [2];
  vector<bool,_std::allocator<bool>_> local_1f8;
  YacclabTests *local_1d0;
  ulong local_1c8;
  pointer local_1c0;
  string local_1b8;
  long *local_198;
  long local_190;
  long local_188 [2];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_178;
  path local_160;
  ulong local_140;
  Labeling *local_138;
  size_t local_130;
  ulong local_128;
  long local_120;
  path local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  OutputBox local_e0;
  
  local_240 = (code *)func;
  local_1d0 = this;
  local_120 = in_R8;
  OutputBox::OutputBox(&local_e0,title,0x50,2);
  local_2f0._M_dataplus._M_p._0_1_ = 1;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_1f8,
             (long)(ccl_algorithms->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(ccl_algorithms->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)&local_2f0,
             (allocator_type *)&local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f8,
           (long)(ccl_algorithms->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(ccl_algorithms->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_2f0);
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  local_248 = ccl_algorithms;
  pLVar11 = LabelingMapSingleton::GetLabeling
                      ((ccl_algorithms->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  (*pLVar11->_vptr_Labeling[7])(&local_2f0,pLVar11);
  std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  pLVar11 = LabelingMapSingleton::GetLabeling(&local_1b8);
  pbVar12 = (local_1d0->mode_cfg_->check_datasets).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((local_1d0->mode_cfg_->check_datasets).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar12) {
    local_1c8 = 0;
    uVar23 = 0;
    pYVar20 = local_1d0;
    local_138 = pLVar11;
    do {
      paVar19 = &local_2d0.field_2;
      local_2b0._M_allocated_capacity = (size_type)&local_2a0;
      pcVar1 = pbVar12[uVar23]._M_dataplus._M_p;
      local_140 = uVar23;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b0,pcVar1,pcVar1 + pbVar12[uVar23]._M_string_length);
      pGVar2 = pYVar20->glob_cfg_;
      filesystem::path::path(&local_290,(string *)&local_2b0);
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      pcVar1 = (pGVar2->input_path).path_._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f0,pcVar1,pcVar1 + (pGVar2->input_path).path_._M_string_length);
      ppVar13 = filesystem::path::operator/=((path *)&local_2f0,&local_290);
      pYVar20 = local_1d0;
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      pcVar1 = (ppVar13->path_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,pcVar1,pcVar1 + (ppVar13->path_)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290.path_._M_dataplus._M_p != &local_290.path_.field_2) {
        operator_delete(local_290.path_._M_dataplus._M_p,
                        local_290.path_.field_2._M_allocated_capacity + 1);
      }
      filesystem::path::path((path *)&local_2d0,&pYVar20->glob_cfg_->input_txt);
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f0,local_270._M_dataplus._M_p,
                 local_270._M_dataplus._M_p + local_270._M_string_length);
      ppVar13 = filesystem::path::operator/=((path *)&local_2f0,(path *)&local_2d0);
      local_290.path_._M_dataplus._M_p = (pointer)&local_290.path_.field_2;
      pcVar1 = (ppVar13->path_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_290,pcVar1,pcVar1 + (ppVar13->path_)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar19) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      local_178.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_178.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar7 = LoadFileList(pYVar20,&local_178,&local_290);
      ppVar6 = local_178.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar5 = local_178.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (bVar7) {
        local_130 = ((long)local_178.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_178.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
        OutputBox::StartUnitaryBox(&local_e0,(string *)&local_2b0,local_130);
        if ((ppVar6 != ppVar5) && ((local_1c8 & 1) == 0)) {
          uVar23 = 0;
          do {
            ProgressBar::Display(&local_e0.pb,(uint)uVar23);
            pcVar1 = local_178.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar23].first._M_dataplus._M_p;
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            local_128 = uVar23;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2d0,pcVar1,
                       pcVar1 + local_178.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar23].first.
                                _M_string_length);
            filesystem::path::path((path *)&local_238,&local_2d0);
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2f0,local_270._M_dataplus._M_p,
                       local_270._M_dataplus._M_p + local_270._M_string_length);
            ppVar13 = filesystem::path::operator/=((path *)&local_2f0,(path *)&local_238);
            local_218 = local_208;
            pcVar1 = (ppVar13->path_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_218,pcVar1,pcVar1 + (ppVar13->path_)._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1
                             );
            }
            pLVar14 = LabelingMapSingleton::GetLabeling
                                ((local_248->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
            iVar9 = (*pLVar14->_vptr_Labeling[9])(pLVar14);
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2f0,local_218,local_210 + (long)local_218);
            cVar8 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar9) + 0x20))
                              ((long *)CONCAT44(extraout_var,iVar9),&local_2f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1
                             );
            }
            if (cVar8 == '\0') {
              std::operator+(&local_238,"Unable to open \'",&local_2d0);
              puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
              local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
              psVar18 = puVar17 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar17 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_2f0.field_2._M_allocated_capacity = *psVar18;
                local_2f0.field_2._8_8_ = puVar17[3];
              }
              else {
                local_2f0.field_2._M_allocated_capacity = *psVar18;
                local_2f0._M_dataplus._M_p = (pointer)*puVar17;
              }
              local_2f0._M_string_length = puVar17[1];
              *puVar17 = psVar18;
              puVar17[1] = 0;
              *(undefined1 *)(puVar17 + 2) = 0;
              OutputBox::Cmessage(&local_e0,&local_2f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                operator_delete(local_2f0._M_dataplus._M_p,
                                local_2f0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != &local_238.field_2) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              (*pLVar11->_vptr_Labeling[2])(pLVar11);
              iVar9 = (*pLVar11->_vptr_Labeling[10])(pLVar11);
              plVar16 = (long *)CONCAT44(extraout_var_00,iVar9);
              (**(code **)(*plVar16 + 0x28))(plVar16);
              (**(code **)(*plVar16 + 0x40))(&local_250,plVar16);
              (*pLVar11->_vptr_Labeling[5])(pLVar11);
              plVar16 = local_250;
              uVar10 = (*pLVar11->_vptr_Labeling[8])(pLVar11);
              (**(code **)(*plVar16 + 0x18))(plVar16,uVar10 & 0xff);
              pbVar12 = (local_248->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              local_1c0 = (local_248->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              if (pbVar12 != local_1c0) {
                uVar23 = 0;
                do {
                  pLVar11 = LabelingMapSingleton::GetLabeling(pbVar12);
                  if ((local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar23 >> 6]
                       >> (uVar23 & 0x3f) & 1) == 0) {
LAB_001dc292:
                    uVar23 = (ulong)((int)uVar23 + 1);
                    bVar3 = false;
                  }
                  else {
                    pcVar15 = local_240;
                    if (((ulong)local_240 & 1) != 0) {
                      pcVar15 = *(code **)(local_240 +
                                          *(long *)((long)&pLVar11->_vptr_Labeling + local_120) + -1
                                          );
                    }
                    (*pcVar15)();
                    iVar9 = (*pLVar11->_vptr_Labeling[10])(pLVar11);
                    plVar16 = (long *)CONCAT44(extraout_var_01,iVar9);
                    (**(code **)(*plVar16 + 0x28))(plVar16);
                    uVar10 = (*pLVar11->_vptr_Labeling[8])(pLVar11);
                    (**(code **)(*plVar16 + 0x18))(plVar16,uVar10 & 0xff);
                    cVar8 = (**(code **)(*local_250 + 0x38))(local_250,plVar16);
                    (*pLVar11->_vptr_Labeling[5])(pLVar11);
                    if (cVar8 == '\0') {
                      local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar23 >> 6] =
                           local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [uVar23 >> 6] & ~(1L << ((byte)uVar23 & 0x3f));
                      filesystem::path::path(&local_160,(string *)&local_2b0);
                      filesystem::path::path(&local_118,&local_2d0);
                      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_2f0,local_160.path_._M_dataplus._M_p,
                                 local_160.path_._M_dataplus._M_p + local_160.path_._M_string_length
                                );
                      ppVar13 = filesystem::path::operator/=((path *)&local_2f0,&local_118);
                      local_198 = local_188;
                      pcVar1 = (ppVar13->path_)._M_dataplus._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_198,pcVar1,
                                 pcVar1 + (ppVar13->path_)._M_string_length);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                        operator_delete(local_2f0._M_dataplus._M_p,
                                        local_2f0.field_2._M_allocated_capacity + 1);
                      }
                      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_238,local_198,local_190 + (long)local_198);
                      std::__cxx11::string::operator=
                                ((string *)
                                 (local_f8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar23),
                                 (string *)&local_238);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_238._M_dataplus._M_p != &local_238.field_2) {
                        operator_delete(local_238._M_dataplus._M_p,
                                        local_238.field_2._M_allocated_capacity + 1);
                      }
                      if (local_198 != local_188) {
                        operator_delete(local_198,local_188[0] + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118.path_._M_dataplus._M_p != &local_118.path_.field_2) {
                        operator_delete(local_118.path_._M_dataplus._M_p,
                                        local_118.path_.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_160.path_._M_dataplus._M_p != &local_160.path_.field_2) {
                        operator_delete(local_160.path_._M_dataplus._M_p,
                                        local_160.path_.field_2._M_allocated_capacity + 1);
                      }
                      _Var25 = std::
                               __adjacent_find<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_comp_iter<std::not_equal_to<int>>>
                                         (local_1f8.super__Bvector_base<std::allocator<bool>_>.
                                          _M_impl.super__Bvector_impl_data._M_start.
                                          super__Bit_iterator_base._M_p,0,
                                          local_1f8.super__Bvector_base<std::allocator<bool>_>.
                                          _M_impl.super__Bvector_impl_data._M_finish.
                                          super__Bit_iterator_base._M_p);
                      if ((_Var25.super__Bit_iterator_base._M_p !=
                           local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) ||
                         (_Var25.super__Bit_iterator_base._M_offset !=
                          local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset))
                      goto LAB_001dc0ad;
                      bVar7 = false;
                      local_1c8 = CONCAT71(_Var25.super__Bit_iterator_base._M_p._1_7_,1);
                      bVar3 = true;
                    }
                    else {
LAB_001dc0ad:
                      bVar3 = false;
                      bVar7 = true;
                    }
                    if (bVar7) goto LAB_001dc292;
                  }
                } while ((!bVar3) && (pbVar12 = pbVar12 + 1, pbVar12 != local_1c0));
              }
              pLVar11 = local_138;
              if (local_250 != (long *)0x0) {
                (**(code **)(*local_250 + 0x10))();
                pLVar11 = local_138;
              }
            }
            if (local_218 != local_208) {
              operator_delete(local_218,local_208[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            uVar23 = (ulong)((int)local_128 + 1);
          } while ((uVar23 < local_130) && ((local_1c8 & 1) == 0));
        }
        ProgressBar::End(&local_e0.pb);
        OutputBox::PrintSeparatorLine(&local_e0);
      }
      else {
        local_218 = local_208;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_218,local_290.path_._M_dataplus._M_p,
                   local_290.path_._M_dataplus._M_p + local_290.path_._M_string_length);
        plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x311cf4);
        psVar18 = (size_type *)(plVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_2d0.field_2._M_allocated_capacity = *psVar18;
          local_2d0.field_2._8_8_ = plVar16[3];
          local_2d0._M_dataplus._M_p = (pointer)paVar19;
        }
        else {
          local_2d0.field_2._M_allocated_capacity = *psVar18;
          local_2d0._M_dataplus._M_p = (pointer)*plVar16;
        }
        local_2d0._M_string_length = plVar16[1];
        *plVar16 = (long)psVar18;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        psVar18 = puVar17 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar17 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_2f0.field_2._M_allocated_capacity = *psVar18;
          local_2f0.field_2._8_8_ = puVar17[3];
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *psVar18;
          local_2f0._M_dataplus._M_p = (pointer)*puVar17;
        }
        local_2f0._M_string_length = puVar17[1];
        *puVar17 = psVar18;
        puVar17[1] = 0;
        *(undefined1 *)(puVar17 + 2) = 0;
        OutputBox::Cwarning(&local_e0,&local_2f0,(string *)&local_2b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != paVar19) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if (local_218 != local_208) {
          operator_delete(local_218,local_208[0] + 1);
        }
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::~vector(&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290.path_._M_dataplus._M_p != &local_290.path_.field_2) {
        operator_delete(local_290.path_._M_dataplus._M_p,
                        local_290.path_.field_2._M_allocated_capacity + 1);
      }
      pYVar20 = local_1d0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      uVar23 = local_140;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_allocated_capacity != &local_2a0) {
        operator_delete((void *)local_2b0._M_allocated_capacity,local_2a0._M_allocated_capacity + 1)
        ;
      }
      uVar23 = (ulong)((int)uVar23 + 1);
      pbVar12 = (pYVar20->mode_cfg_->check_datasets).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar23 < (ulong)((long)(pYVar20->mode_cfg_->check_datasets).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5)
            );
  }
  pvVar4 = local_248;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_2d0,
           (ulong)((long)(local_248->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_248->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start) >> 5 & 0xffffffff,
           (allocator_type *)&local_2f0);
  pbVar12 = (pvVar4->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar21 = (pvVar4->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  rhs = pbVar12 + 1;
  lhs = pbVar12;
  if (rhs != pbVar21 && pbVar12 != pbVar21) {
    do {
      bVar7 = CompareLengthCvString(lhs,rhs);
      pbVar12 = rhs;
      if (!bVar7) {
        pbVar12 = lhs;
      }
      rhs = rhs + 1;
      lhs = pbVar12;
    } while (rhs != pbVar21);
  }
  pbVar21 = (local_248->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_1c0 = (local_248->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar21 != local_1c0) {
    local_240 = (code *)(ulong)(uint)pbVar12->_M_string_length;
    uVar10 = 0;
    do {
      std::operator+(&local_270,"\'",pbVar21);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_270);
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 == paVar19) {
        local_2a0._M_allocated_capacity = paVar19->_M_allocated_capacity;
        local_2a0._8_8_ = plVar16[3];
        local_2b0._M_allocated_capacity = (size_type)&local_2a0;
      }
      else {
        local_2a0._M_allocated_capacity = paVar19->_M_allocated_capacity;
        local_2b0._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar16;
      }
      local_2b0._8_8_ = plVar16[1];
      *plVar16 = (long)paVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_290.path_._M_dataplus._M_p = (pointer)&local_290.path_.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_290,(char)local_240 - (char)pbVar21->_M_string_length);
      uVar24 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_allocated_capacity != &local_2a0) {
        uVar24 = local_2a0._M_allocated_capacity;
      }
      if ((ulong)uVar24 < local_290.path_._M_string_length + local_2b0._8_8_) {
        uVar24 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290.path_._M_dataplus._M_p != &local_290.path_.field_2) {
          uVar24 = local_290.path_.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < local_290.path_._M_string_length + local_2b0._8_8_) goto LAB_001dc772;
        puVar17 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_290,0,(char *)0x0,local_2b0._M_allocated_capacity);
      }
      else {
LAB_001dc772:
        puVar17 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            (local_2b0._M_local_buf,(ulong)local_290.path_._M_dataplus._M_p);
      }
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      psVar18 = puVar17 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_2f0.field_2._M_allocated_capacity = *psVar18;
        local_2f0.field_2._8_8_ = puVar17[3];
      }
      else {
        local_2f0.field_2._M_allocated_capacity = *psVar18;
        local_2f0._M_dataplus._M_p = (pointer)*puVar17;
      }
      local_2f0._M_string_length = puVar17[1];
      *puVar17 = psVar18;
      puVar17[1] = 0;
      *(undefined1 *)psVar18 = 0;
      uVar23 = (ulong)uVar10;
      lVar22 = uVar23 * 0x20;
      std::__cxx11::string::operator=
                ((string *)(local_2d0._M_dataplus._M_p + lVar22),(string *)&local_2f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290.path_._M_dataplus._M_p != &local_290.path_.field_2) {
        operator_delete(local_290.path_._M_dataplus._M_p,
                        local_290.path_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_allocated_capacity != &local_2a0) {
        operator_delete((void *)local_2b0._M_allocated_capacity,local_2a0._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar10 >> 6] >> (uVar23 & 0x3f) & 1) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2b0,"-> NOT correct, it first fails on \'",
                       local_f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar23);
        puVar17 = (undefined8 *)std::__cxx11::string::append(local_2b0._M_local_buf);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        psVar18 = puVar17 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar17 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_2f0.field_2._M_allocated_capacity = *psVar18;
          local_2f0.field_2._8_8_ = puVar17[3];
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *psVar18;
          local_2f0._M_dataplus._M_p = (pointer)*puVar17;
        }
        local_2f0._M_string_length = puVar17[1];
        *puVar17 = psVar18;
        puVar17[1] = 0;
        *(undefined1 *)(puVar17 + 2) = 0;
        std::__cxx11::string::_M_append
                  (local_2d0._M_dataplus._M_p + lVar22,(ulong)local_2f0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_allocated_capacity != &local_2a0) {
          operator_delete((void *)local_2b0._M_allocated_capacity,
                          local_2a0._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::append(local_2d0._M_dataplus._M_p + lVar22);
      }
      uVar10 = uVar10 + 1;
      pbVar21 = pbVar21 + 1;
    } while (pbVar21 != local_1c0);
  }
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"Report","");
  OutputBox::DisplayReport
            (&local_e0,&local_2f0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,
                    CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                             local_1b8.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  if (local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.pb.pre_message_._M_dataplus._M_p != &local_e0.pb.pre_message_.field_2) {
    operator_delete(local_e0.pb.pre_message_._M_dataplus._M_p,
                    local_e0.pb.pre_message_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.pb.post_message_._M_dataplus._M_p != &local_e0.pb.post_message_.field_2) {
    operator_delete(local_e0.pb.post_message_._M_dataplus._M_p,
                    local_e0.pb.post_message_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.title_._M_dataplus._M_p != &local_e0.title_.field_2) {
    operator_delete(local_e0.title_._M_dataplus._M_p,
                    local_e0.title_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CheckAlgorithms(const std::string& title, const std::vector<std::string>& ccl_algorithms, const FnP func, Args&&... args) {

		OutputBox ob(title);

		std::vector<bool> stats(ccl_algorithms.size(), true);  // True if the i-th algorithm is correct, false otherwise
		std::vector<std::string> first_fail(ccl_algorithms.size());  // Name of the file on which algorithm fails the first time
		bool stop = false; // True if all the algorithms are not correct

		std::string correct_algo_name;
		try {
			correct_algo_name = LabelingMapSingleton::GetLabeling(ccl_algorithms[0])->CheckAlg();
		}
		catch (std::out_of_range) {
			ob.Cwarning("No correct algorithm is available, correctness test skipped.");
			return;
		}
		Labeling* correct_algo = LabelingMapSingleton::GetLabeling(correct_algo_name);

		for (unsigned i = 0; i < mode_cfg_.check_datasets.size(); ++i) { // For every dataset in the check_datasets list
			std::string dataset_name(mode_cfg_.check_datasets[i]);
			path dataset_path(glob_cfg_.input_path / path(dataset_name));
			path is_path = dataset_path / path(glob_cfg_.input_txt); // files.txt path

			// Load list of images on which ccl_algorithms must be tested
			std::vector<std::pair<std::string, bool>> filenames; // first: filename, second: state of filename (find or not)
			if (!LoadFileList(filenames, is_path)) {
				ob.Cwarning("Unable to open '" + is_path.string() + "'", dataset_name);
				continue;
			}

			// Number of files
			size_t filenames_size = filenames.size();
			ob.StartUnitaryBox(dataset_name, filenames_size);

			for (unsigned file = 0; file < filenames_size && !stop; ++file) { // For each file in list
				ob.UpdateUnitaryBox(file);

				std::string filename = filenames[file].first;
				path filename_path = dataset_path / path(filename);

				// Load image
				if (!LabelingMapSingleton::GetLabeling(ccl_algorithms[0])->GetInput()->ReadBinary(filename_path.string())) {
					ob.Cmessage("Unable to open '" + filename + "'");
					continue;
				}

				// These variables aren't necessary
				// unsigned n_labels_correct, n_labels_to_control;
				
				correct_algo->PerformLabeling();
				//n_labels_correct = sauf->n_labels_;
                YacclabTensorOutput* correct_algo_out = correct_algo->GetOutput();
                correct_algo_out->PrepareForCheck();

                std::unique_ptr<YacclabTensorOutput> labels_correct = correct_algo_out->Copy();

                correct_algo->FreeLabelingData();

                labels_correct->NormalizeLabels(correct_algo->IsLabelBackground());

				unsigned j = 0;
				for (const auto& algo_name : ccl_algorithms) {
					Labeling *algorithm = LabelingMapSingleton::GetLabeling(algo_name);

					// Perform labeling on current algorithm if it has no previously failed
					if (stats[j]) {
						(algorithm->*func)(std::forward<Args>(args)...);
                        YacclabTensorOutput* labels_to_check = algorithm->GetOutput();
                        labels_to_check->PrepareForCheck();
                        labels_to_check->NormalizeLabels(algorithm->IsLabelBackground());
                        const bool correct = labels_correct->Equals(labels_to_check);
                        // const bool diff = algorithm->Check(correct_algo);
						algorithm->FreeLabelingData();
						if (!correct) {
							stats[j] = false;
							first_fail[j] = (path(dataset_name) / path(filename)).string();

							// Stop check test if all the algorithms fail
							if (adjacent_find(stats.begin(), stats.end(), std::not_equal_to<int>()) == stats.end()) {
								stop = true;
								break;
							}
						}
					}
					++j;
				} // For all the Algorithms in the array
                //correct_algo->FreeLabelingData();

			}// END WHILE (LIST OF IMAGES)
			ob.StopUnitaryBox();
		}// END FOR (LIST OF DATASETS)

		// LabelingMapSingleton::GetLabeling(ccl_algorithms[0])->ReleaseInput();

		 // To display report of correctness test
		std::vector<std::string> messages(static_cast<unsigned int>(ccl_algorithms.size()));
		unsigned longest_name = static_cast<unsigned>(max_element(ccl_algorithms.begin(), ccl_algorithms.end(), CompareLengthCvString)->length());

		unsigned j = 0;
		for (const auto& algo_name : ccl_algorithms) {
			messages[j] = "'" + algo_name + "'" + std::string(longest_name - algo_name.size(), '-');
			if (stats[j]) {
				messages[j] += "-> correct!";
			}
			else {
				messages[j] += "-> NOT correct, it first fails on '" + first_fail[j] + "'";
			}
			++j;
		}
		ob.DisplayReport("Report", messages);
	}